

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall
Js::JSONStringifier::ReadProperty
          (JSONStringifier *this,JavascriptString *key,RecyclableObject *holder,JSONProperty *prop,
          Var value,JSONObjectStack *objectStack)

{
  bool bVar1;
  BOOL BVar2;
  ThreadContext *this_00;
  JSONObjectStack *pJVar3;
  JSONArray *ptr;
  JSONObject *ptr_00;
  RecyclableObject *local_70;
  Var primitive;
  Var toJSONValue;
  RecyclableObject *pRStack_48;
  bool isObject;
  RecyclableObject *valueObj;
  JSONObjectStack *objectStack_local;
  Var value_local;
  JSONProperty *prop_local;
  RecyclableObject *holder_local;
  JavascriptString *key_local;
  JSONStringifier *this_local;
  
  valueObj = (RecyclableObject *)objectStack;
  objectStack_local = (JSONObjectStack *)value;
  value_local = prop;
  prop_local = (JSONProperty *)holder;
  holder_local = &key->super_RecyclableObject;
  key_local = (JavascriptString *)this;
  this_00 = ScriptContext::GetThreadContext(this->scriptContext);
  ThreadContext::ProbeStack(this_00,0xc00,this->scriptContext,(PVOID)0x0);
  this_local = (JSONStringifier *)objectStack_local;
  bVar1 = VarIs<Js::RecyclableObject>(objectStack_local);
  if (bVar1) {
    local_70 = UnsafeVarTo<Js::RecyclableObject>(this_local);
  }
  else {
    local_70 = (RecyclableObject *)0x0;
  }
  pRStack_48 = local_70;
  toJSONValue._7_1_ = 0;
  if (local_70 != (RecyclableObject *)0x0) {
    BVar2 = Js::JavascriptOperators::IsObject(local_70);
    toJSONValue._7_1_ = BVar2 != 0;
    if (((bool)toJSONValue._7_1_) &&
       (pJVar3 = (JSONObjectStack *)ToJSON(this,(JavascriptString *)holder_local,pRStack_48),
       pJVar3 != (JSONObjectStack *)0x0)) {
      objectStack_local = pJVar3;
      RecheckValue(pJVar3,&stack0xffffffffffffffb8,(bool *)((long)&toJSONValue + 7));
    }
  }
  if (this->replacerFunction != (RecyclableObject *)0x0) {
    objectStack_local =
         (JSONObjectStack *)
         CallReplacerFunction
                   (this,(RecyclableObject *)prop_local,(JavascriptString *)holder_local,
                    objectStack_local);
    RecheckValue(objectStack_local,&stack0xffffffffffffffb8,(bool *)((long)&toJSONValue + 7));
  }
  if (pRStack_48 != (RecyclableObject *)0x0) {
    bVar1 = JavascriptConversion::IsCallable(pRStack_48);
    if ((bVar1) && (BVar2 = Js::JavascriptOperators::IsJsNativeObject(pRStack_48), BVar2 != 0)) {
      *(undefined1 *)value_local = 2;
      return;
    }
    bVar1 = Js::JavascriptOperators::IsArray(pRStack_48);
    if (bVar1) {
      *(undefined1 *)value_local = 0;
      ptr = ReadArray(this,pRStack_48,(JSONObjectStack *)valueObj);
      Memory::WriteBarrierPtr<Js::JSONArray>::operator=
                ((WriteBarrierPtr<Js::JSONArray> *)((long)value_local + 8),ptr);
      return;
    }
    pJVar3 = (JSONObjectStack *)TryConvertPrimitiveObject(this,pRStack_48);
    if (pJVar3 != (JSONObjectStack *)0x0) {
      objectStack_local = pJVar3;
      RecheckValue(pJVar3,&stack0xffffffffffffffb8,(bool *)((long)&toJSONValue + 7));
    }
    if ((toJSONValue._7_1_ & 1) != 0) {
      *(undefined1 *)value_local = 1;
      ptr_00 = ReadObject(this,pRStack_48,(JSONObjectStack *)valueObj);
      Memory::WriteBarrierPtr<SListCounted<Js::JSONObjectProperty,_Memory::Recycler>_>::operator=
                ((WriteBarrierPtr<SListCounted<Js::JSONObjectProperty,_Memory::Recycler>_> *)
                 ((long)value_local + 8),ptr_00);
      return;
    }
    if (pRStack_48 != (RecyclableObject *)0x0) {
      ReadData(this,pRStack_48,(JSONProperty *)value_local);
      return;
    }
  }
  ReadData(this,objectStack_local,(JSONProperty *)value_local);
  return;
}

Assistant:

void
JSONStringifier::ReadProperty(
    _In_ JavascriptString* key,
    _In_opt_ RecyclableObject* holder,
    _Out_ JSONProperty* prop,
    _In_ Var value,
    _In_ JSONObjectStack* objectStack)
{
    PROBE_STACK(this->scriptContext, Constants::MinStackDefault);

    // Save these to avoid having to recheck conditions unless value is modified by ToJSON or a replacer function
    RecyclableObject* valueObj = JavascriptOperators::TryFromVar<RecyclableObject>(value);
    bool isObject = false;
    if (valueObj)
    {
        isObject = JavascriptOperators::IsObject(valueObj) != FALSE;
        if (isObject)
        {
            // If value is an object, we must first check if it has a ToJSON method
            Var toJSONValue = this->ToJSON(key, valueObj);
            if (toJSONValue != nullptr)
            {
                value = toJSONValue;
                RecheckValue(toJSONValue, &valueObj, &isObject);
            }
        }
    }

    // If user provided a replacer function, we need to call it
    if (this->replacerFunction != nullptr)
    {
        value = this->CallReplacerFunction(holder, key, value);
        RecheckValue(value, &valueObj, &isObject);
    }

    if (valueObj != nullptr)
    {
        // Callable JS objects are undefined, but we still stringify callable host objects
        // Host object case is for compat with old implementation, but isn't defined in the
        // spec, so we should consider removing it
        if (JavascriptConversion::IsCallable(valueObj) && JavascriptOperators::IsJsNativeObject(valueObj))
        {
            prop->type = JSONContentType::Undefined;
            return;
        }

        if (JavascriptOperators::IsArray(valueObj))
        {
            prop->type = JSONContentType::Array;
            prop->arr = this->ReadArray(valueObj, objectStack);
            return;
        }

        Var primitive = this->TryConvertPrimitiveObject(valueObj);
        if (primitive != nullptr)
        {
            value = primitive;
            RecheckValue(value, &valueObj, &isObject);
        }

        if (isObject)
        {
            prop->type = JSONContentType::Object;
            prop->obj = this->ReadObject(valueObj, objectStack);
            return;
        }

        if (valueObj != nullptr)
        {
            this->ReadData(valueObj, prop);
            return;
        }
    }
    this->ReadData(value, prop);
    return;
}